

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Deserializer.hpp
# Opt level: O2

void mserialize::detail::
     BuiltinDeserializer<std::forward_list<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>,_void>
     ::deserialize_elems_noinsert<InputStream>(long *param_1,undefined8 param_2,undefined8 param_3)

{
  while (param_1 = (long *)*param_1, param_1 != (long *)0x0) {
    BuiltinDeserializer<std::tuple<char,int>,void>::deserialize_elems<InputStream,0ul,1ul>
              (param_1 + 1,param_3);
  }
  return;
}

Assistant:

static void deserialize_elems_noinsert(
    std::false_type /* no batch deserialization */,
    std::false_type /* not a proxy sequence */,
    Sequence& s, std::uint32_t /*size*/, InputStream& istream
  )
  {
    for (auto&& elem : s)
    {
      mserialize::deserialize(elem, istream);
    }
  }